

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZQuadSphere.h
# Opt level: O3

void __thiscall
pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>::X<double>
          (TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_> *this,TPZFMatrix<double> *coord,
          TPZVec<double> *loc,TPZVec<double> *result)

{
  double *pdVar1;
  double *pdVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  TPZManVector<double,_3> xqsiLxc;
  TPZManVector<double,_3> xqsi;
  double local_a0;
  TPZManVector<double,_3> local_98;
  TPZManVector<double,_3> local_60;
  
  local_98.super_TPZVec<double>._vptr_TPZVec = (_func_int **)0x0;
  TPZManVector<double,_3>::TPZManVector(&local_60,3,(double *)&local_98);
  local_a0 = 0.0;
  TPZManVector<double,_3>::TPZManVector(&local_98,3,&local_a0);
  TPZGeoBlend<pzgeom::TPZGeoQuad>::X<double>
            (&this->super_TPZGeoBlend<pzgeom::TPZGeoQuad>,coord,loc,&local_60.super_TPZVec<double>);
  pdVar1 = (this->fxc).fStore;
  dVar4 = 0.0;
  lVar3 = 0;
  do {
    dVar5 = local_60.super_TPZVec<double>.fStore[lVar3] - pdVar1[lVar3];
    local_98.super_TPZVec<double>.fStore[lVar3] = dVar5;
    dVar4 = dVar4 + dVar5 * dVar5;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  if (dVar4 < 0.0) {
    dVar4 = sqrt(dVar4);
  }
  else {
    dVar4 = SQRT(dVar4);
  }
  pdVar1 = (this->fxc).fStore;
  pdVar2 = result->fStore;
  lVar3 = 0;
  do {
    pdVar2[lVar3] = (local_98.super_TPZVec<double>.fStore[lVar3] * this->fR) / dVar4 + pdVar1[lVar3]
    ;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  TPZManVector<double,_3>::~TPZManVector(&local_98);
  TPZManVector<double,_3>::~TPZManVector(&local_60);
  return;
}

Assistant:

void X(TPZFMatrix<REAL> &coord,TPZVec<T> &loc,TPZVec<T> &result) const
		{
            TPZManVector<T,3> xqsi(3,0.); // will store (x,y,z) from (qsi,eta)
            TPZManVector<T,3> xqsiLxc(3,0.); // will store (x,y,z)-xc
            GeomQuad::X(coord,loc,xqsi); // gives the map (qsi,eta) to (x,y,z)
            
            T norm = 0.;
            for (int i = 0; i < 3; i++) { // Does xqsi-xc and calculates its norm
                xqsiLxc[i] = xqsi[i] - fxc[i];
                norm += xqsiLxc[i] * xqsiLxc[i];
            }
            norm = sqrt(norm);
            
            for (int i = 0; i < 3; i++) {
                result[i] = fxc[i] + xqsiLxc[i] * fR / norm;
            }
                
            
		}